

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

_Bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode *node)

{
  bool bVar1;
  _Bool ret;
  ImGuiDockNode *node_local;
  
  if ((node->TabBar == (ImGuiTabBar *)0x0) || (node->HostWindow == (ImGuiWindow_conflict *)0x0)) {
    node_local._7_1_ = false;
  }
  else if ((node->MergedFlags & 1U) == 0) {
    Begin(node->HostWindow->Name,(_Bool *)0x0,0);
    PushOverrideID(node->ID);
    bVar1 = BeginTabBarEx(node->TabBar,&node->TabBar->BarRect,node->TabBar->Flags,node);
    if (!bVar1) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x37bc,"bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode *)");
    }
    node_local._7_1_ = true;
  }
  else {
    node_local._7_1_ = false;
  }
  return node_local._7_1_;
}

Assistant:

bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode* node)
{
    if (node->TabBar == NULL || node->HostWindow == NULL)
        return false;
    if (node->MergedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return false;
    Begin(node->HostWindow->Name);
    PushOverrideID(node->ID);
    bool ret = BeginTabBarEx(node->TabBar, node->TabBar->BarRect, node->TabBar->Flags, node);
    IM_UNUSED(ret);
    IM_ASSERT(ret);
    return true;
}